

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::MultisampleTests::init(MultisampleTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  CommonEdgeCase *pCVar2;
  MaskProportionalityCase *pMVar3;
  MaskConstancyCase *pMVar4;
  
  pTVar1 = (TestNode *)operator_new(200);
  PolygonNumSamplesCase::PolygonNumSamplesCase
            ((PolygonNumSamplesCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "num_samples_polygon","Test sanity of the value of GL_SAMPLES, with polygons");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(200);
  LineNumSamplesCase::LineNumSamplesCase
            ((LineNumSamplesCase *)pTVar1,(this->super_TestCaseGroup).m_context,"num_samples_line",
             "Test sanity of the value of GL_SAMPLES, with lines");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pCVar2 = (CommonEdgeCase *)operator_new(0xb8);
  CommonEdgeCase::CommonEdgeCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"common_edge_small_quads",
             "Test polygons\' common edges with small quads",CASETYPE_SMALL_QUADS);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar2);
  pCVar2 = (CommonEdgeCase *)operator_new(0xb8);
  CommonEdgeCase::CommonEdgeCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"common_edge_big_quad",
             "Test polygons\' common edges with bigger-than-viewport quads",
             CASETYPE_BIGGER_THAN_VIEWPORT_QUAD);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar2);
  pCVar2 = (CommonEdgeCase *)operator_new(0xb8);
  CommonEdgeCase::CommonEdgeCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"common_edge_viewport_quad",
             "Test polygons\' common edges with exactly viewport-sized quads",
             CASETYPE_FIT_VIEWPORT_QUAD);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar2);
  pTVar1 = (TestNode *)operator_new(200);
  SampleDepthCase::SampleDepthCase
            ((SampleDepthCase *)pTVar1,(this->super_TestCaseGroup).m_context,"depth",
             "Test that depth values are per-sample");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa8);
  SampleStencilCase::SampleStencilCase
            ((SampleStencilCase *)pTVar1,(this->super_TestCaseGroup).m_context,"stencil",
             "Test that stencil values are per-sample");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa8);
  CoverageMaskInvertCase::CoverageMaskInvertCase
            ((CoverageMaskInvertCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "sample_coverage_invert",
             "Test that non-inverted and inverted sample coverage masks are each other\'s negations"
            );
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pMVar3 = (MaskProportionalityCase *)operator_new(0xb8);
  MaskProportionalityCase::MaskProportionalityCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"proportionality_alpha_to_coverage",
             "Test the proportionality property of GL_SAMPLE_ALPHA_TO_COVERAGE",
             CASETYPE_ALPHA_TO_COVERAGE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar3);
  pMVar3 = (MaskProportionalityCase *)operator_new(0xb8);
  MaskProportionalityCase::MaskProportionalityCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"proportionality_sample_coverage",
             "Test the proportionality property of GL_SAMPLE_COVERAGE",CASETYPE_SAMPLE_COVERAGE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar3);
  pMVar3 = (MaskProportionalityCase *)operator_new(0xb8);
  MaskProportionalityCase::MaskProportionalityCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"proportionality_sample_coverage_inverted"
             ,"Test the proportionality property of inverted-mask GL_SAMPLE_COVERAGE",
             CASETYPE_SAMPLE_COVERAGE_INVERTED);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar3);
  pMVar4 = (MaskConstancyCase *)operator_new(0xb0);
  MaskConstancyCase::MaskConstancyCase
            (pMVar4,(this->super_TestCaseGroup).m_context,"constancy_alpha_to_coverage",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE"
             ,CASETYPE_ALPHA_TO_COVERAGE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar4);
  pMVar4 = (MaskConstancyCase *)operator_new(0xb0);
  MaskConstancyCase::MaskConstancyCase
            (pMVar4,(this->super_TestCaseGroup).m_context,"constancy_sample_coverage",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_COVERAGE"
             ,CASETYPE_SAMPLE_COVERAGE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar4);
  pMVar4 = (MaskConstancyCase *)operator_new(0xb0);
  MaskConstancyCase::MaskConstancyCase
            (pMVar4,(this->super_TestCaseGroup).m_context,"constancy_sample_coverage_inverted",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using inverted-mask GL_SAMPLE_COVERAGE"
             ,CASETYPE_SAMPLE_COVERAGE_INVERTED);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar4);
  pMVar4 = (MaskConstancyCase *)operator_new(0xb0);
  MaskConstancyCase::MaskConstancyCase
            (pMVar4,(this->super_TestCaseGroup).m_context,"constancy_both",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and GL_SAMPLE_COVERAGE"
             ,CASETYPE_BOTH);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar4);
  pMVar4 = (MaskConstancyCase *)operator_new(0xb0);
  MaskConstancyCase::MaskConstancyCase
            (pMVar4,(this->super_TestCaseGroup).m_context,"constancy_both_inverted",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and inverted-mask GL_SAMPLE_COVERAGE"
             ,CASETYPE_BOTH_INVERTED);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar4);
  return extraout_EAX;
}

Assistant:

void MultisampleTests::init (void)
{
	addChild(new PolygonNumSamplesCase		(m_context, "num_samples_polygon",			"Test sanity of the value of GL_SAMPLES, with polygons"));
	addChild(new LineNumSamplesCase			(m_context, "num_samples_line",				"Test sanity of the value of GL_SAMPLES, with lines"));
	addChild(new CommonEdgeCase				(m_context, "common_edge_small_quads",		"Test polygons' common edges with small quads",						CommonEdgeCase::CASETYPE_SMALL_QUADS));
	addChild(new CommonEdgeCase				(m_context, "common_edge_big_quad",			"Test polygons' common edges with bigger-than-viewport quads",		CommonEdgeCase::CASETYPE_BIGGER_THAN_VIEWPORT_QUAD));
	addChild(new CommonEdgeCase				(m_context, "common_edge_viewport_quad",	"Test polygons' common edges with exactly viewport-sized quads",	CommonEdgeCase::CASETYPE_FIT_VIEWPORT_QUAD));
	addChild(new SampleDepthCase			(m_context, "depth",						"Test that depth values are per-sample"));
	addChild(new SampleStencilCase			(m_context, "stencil",						"Test that stencil values are per-sample"));
	addChild(new CoverageMaskInvertCase		(m_context, "sample_coverage_invert",		"Test that non-inverted and inverted sample coverage masks are each other's negations"));

	addChild(new MaskProportionalityCase(m_context, "proportionality_alpha_to_coverage",			"Test the proportionality property of GL_SAMPLE_ALPHA_TO_COVERAGE",			MaskProportionalityCase::CASETYPE_ALPHA_TO_COVERAGE));
	addChild(new MaskProportionalityCase(m_context, "proportionality_sample_coverage",				"Test the proportionality property of GL_SAMPLE_COVERAGE",					MaskProportionalityCase::CASETYPE_SAMPLE_COVERAGE));
	addChild(new MaskProportionalityCase(m_context, "proportionality_sample_coverage_inverted",		"Test the proportionality property of inverted-mask GL_SAMPLE_COVERAGE",	MaskProportionalityCase::CASETYPE_SAMPLE_COVERAGE_INVERTED));

	addChild(new MaskConstancyCase(m_context, "constancy_alpha_to_coverage",			"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE",											MaskConstancyCase::CASETYPE_ALPHA_TO_COVERAGE));
	addChild(new MaskConstancyCase(m_context, "constancy_sample_coverage",				"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_COVERAGE",													MaskConstancyCase::CASETYPE_SAMPLE_COVERAGE));
	addChild(new MaskConstancyCase(m_context, "constancy_sample_coverage_inverted",		"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using inverted-mask GL_SAMPLE_COVERAGE",									MaskConstancyCase::CASETYPE_SAMPLE_COVERAGE_INVERTED));
	addChild(new MaskConstancyCase(m_context, "constancy_both",							"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and GL_SAMPLE_COVERAGE",					MaskConstancyCase::CASETYPE_BOTH));
	addChild(new MaskConstancyCase(m_context, "constancy_both_inverted",				"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and inverted-mask GL_SAMPLE_COVERAGE",	MaskConstancyCase::CASETYPE_BOTH_INVERTED));
}